

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O1

CWordWidthHint __thiscall
CTextRender::MakeWord
          (CTextRender *this,CTextCursor *pCursor,char *pText,char *pEnd,int FontSizeIndex,
          float Size,int PixelSize,vec2 ScreenScale)

{
  float fVar1;
  uint uVar2;
  float fVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  CGlyph *pLeft;
  ulong uVar8;
  CGlyph *pRight;
  uint uVar9;
  byte bVar10;
  ulong uVar11;
  uint Chr;
  CGlyphMap *this_00;
  CGlyph *pGlyph;
  uint uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  uint uVar14;
  vec2 vVar15;
  float fVar16;
  CWordWidthHint CVar17;
  char *pCur;
  CScaledGlyph Scaled;
  float local_110;
  long local_d8;
  ulong local_a8;
  undefined1 local_80 [16];
  CTextureHandle local_70;
  CTextureHandle local_6c;
  int local_68;
  vec2 local_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  ivec2 local_4c;
  undefined8 uStack_44;
  vector3_base<int> *local_38;
  
  local_38 = *(vector3_base<int> **)(in_FS_OFFSET + 0x28);
  uVar2 = pCursor->m_Flags;
  local_80._0_8_ = pText;
  uVar5 = str_utf8_decode((char **)local_80);
  if ((int)uVar5 < 1) {
    pLeft = (CGlyph *)0x0;
  }
  else {
    uVar14 = 0x20;
    if (1 < uVar5 - 9) {
      uVar14 = uVar5;
    }
    pLeft = CGlyphMap::GetGlyph(this->m_pGlyphMap,uVar14,FontSizeIndex,(uVar2 & 1) == 0);
  }
  fVar1 = (pCursor->m_Advance).field_0.x;
  uVar11 = 0;
  uVar8 = 0xffffffff00000000;
  local_110 = fVar1;
  if ((*pText != '\0') && ((ulong)local_80._0_8_ <= pEnd)) {
    uVar14 = -(uint)(pCursor->m_MaxWidth < 0.0);
    fVar3 = (float)(~uVar14 & (uint)pCursor->m_MaxWidth | uVar14 & 0x7f800000);
    local_a8 = 0;
    local_d8 = 0;
    uVar6 = 0;
    uVar14 = 0;
    do {
      uVar12 = (int)local_80._0_8_ - (int)pText;
      uVar9 = uVar14;
      if (pEnd < (ulong)local_80._0_8_ || uVar5 == 0) {
        uVar12 = uVar12 - 1;
        pRight = pLeft;
        uVar7 = uVar5;
LAB_001317cc:
        bVar13 = false;
        pLeft = pRight;
        uVar5 = uVar7;
        uVar9 = uVar14;
      }
      else if ((int)uVar5 < 0 || pLeft == (CGlyph *)0x0) {
        bVar13 = false;
        uVar12 = 0xffffffff;
      }
      else {
        this_00 = (CGlyphMap *)local_80;
        uVar7 = str_utf8_decode((char **)this_00);
        if ((int)uVar7 < 1) {
          pRight = (CGlyph *)0x0;
        }
        else {
          Chr = uVar7;
          if (uVar7 - 9 < 2) {
            Chr = 0x20;
          }
          this_00 = this->m_pGlyphMap;
          pRight = CGlyphMap::GetGlyph(this_00,Chr,FontSizeIndex,(uVar2 & 1) == 0);
        }
        vVar15 = CGlyphMap::Kerning(this_00,pLeft,pRight,PixelSize);
        cVar4 = uVar5 != 0x20 && uVar5 - 0xb < 0xfffffffe;
        if (((uVar2 & 8) != 0) &&
           ((0x20 < uVar5 || ((0x100000600U >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) {
          cVar4 = pCursor->m_StartOfLine;
        }
        if ((fVar3 < local_110 - fVar1) ||
           ((fVar16 = (vVar15.field_0.x * (1.0 / (float)PixelSize) + pLeft->m_AdvanceX) * Size,
            cVar4 != '\0' && (fVar3 < (pCursor->m_Advance).field_0.x + fVar16)))) {
          bVar13 = false;
          local_d8 = 1;
          pLeft = pRight;
          uVar5 = uVar7;
          uVar12 = uVar6;
        }
        else {
          if ((uVar2 & 1) == 0) {
            local_6c.m_Id = uVar12 - uVar6;
            local_64 = pCursor->m_Advance;
            local_68 = pCursor->m_LineCount + -1;
            local_5c._0_4_ = (int)this->m_TextR;
            local_5c._4_4_ = (int)this->m_TextG;
            uStack_54._0_4_ = (int)this->m_TextB;
            uStack_54._4_4_ = (int)this->m_TextA;
            local_4c.field_0 =
                 (anon_union_4_2_94730284_for_vector2_base<int>_1)this->m_TextSecondaryR;
            local_4c.field_1 =
                 (anon_union_4_2_947302a4_for_vector2_base<int>_3)this->m_TextSecondaryG;
            uStack_44._0_4_ = (int)this->m_TextSecondaryB;
            uStack_44._4_4_ = (int)this->m_TextSecondaryA;
            local_80._8_8_ = pLeft;
            local_70.m_Id = (int)Size;
            array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::add
                      (&pCursor->m_Glyphs,(CScaledGlyph *)(local_80 + 8));
          }
          fVar16 = fVar16 + (pCursor->m_Advance).field_0.x;
          (pCursor->m_Advance).field_0.x = fVar16;
          uVar9 = uVar14 + 1;
          if ((uVar5 < 0x21) && ((0x100000600U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
            local_a8 = (ulong)(uVar5 == 10);
            bVar10 = (byte)uVar2 >> 1 & uVar5 == 10;
            if (bVar10 != 0) {
              uVar9 = uVar14;
            }
            bVar13 = false;
            pLeft = pRight;
            uVar5 = uVar7;
            if (((uVar2 & 1) == 0) && (bVar10 != 0)) {
              array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::remove_index
                        (&pCursor->m_Glyphs,(pCursor->m_Glyphs).num_elements + -1);
              goto LAB_001317cc;
            }
          }
          else {
            bVar13 = uVar5 - 0x20 < 0x2170;
            pLeft = pRight;
            uVar5 = uVar7;
            local_110 = fVar16;
          }
        }
      }
      uVar6 = uVar12;
      uVar14 = uVar9;
    } while (bVar13);
    uVar8 = (ulong)uVar12 << 0x20;
    uVar11 = (ulong)uVar9 | local_a8 << 0x20 | local_d8 << 0x28;
  }
  if (*(vector3_base<int> **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  CVar17._0_8_ = uVar8 | (uint)local_110;
  CVar17.m_GlyphCount = (int)uVar11;
  CVar17.m_EndsWithNewline = (bool)(char)(uVar11 >> 0x20);
  CVar17.m_IsBroken = (bool)(char)(uVar11 >> 0x28);
  CVar17._14_2_ = (short)(uVar11 >> 0x30);
  return CVar17;
}

Assistant:

CWordWidthHint CTextRender::MakeWord(CTextCursor *pCursor, const char *pText, const char *pEnd, 
								int FontSizeIndex, float Size, int PixelSize, vec2 ScreenScale)
{
	bool Render = !(pCursor->m_Flags & TEXTFLAG_NO_RENDER);
	bool BreakWord = !(pCursor->m_Flags & TEXTFLAG_WORD_WRAP);
	bool AllowNewline = pCursor->m_Flags & TEXTFLAG_ALLOW_NEWLINE;
	CWordWidthHint Hint;
	const char *pCur = pText;
	int NextChr = str_utf8_decode(&pCur);
	CGlyph *pNextGlyph = NULL;
	if(NextChr > 0)
	{
		if(NextChr == '\n' || NextChr == '\t')
			pNextGlyph = m_pGlyphMap->GetGlyph(' ', FontSizeIndex, Render);
		else
			pNextGlyph = m_pGlyphMap->GetGlyph(NextChr, FontSizeIndex, Render);
	}

	float Scale = 1.0f/PixelSize;
	float MaxWidth = pCursor->m_MaxWidth;
	if(MaxWidth < 0)
		MaxWidth = INFINITY;

	float WordStartAdvanceX = pCursor->m_Advance.x;

	Hint.m_CharCount = 0;
	Hint.m_GlyphCount = 0;
	Hint.m_EffectiveAdvanceX = pCursor->m_Advance.x;
	Hint.m_EndsWithNewline = false;
	Hint.m_IsBroken = false;

	if(*pText == '\0' || pCur > pEnd)
	{
		Hint.m_CharCount = -1;
		return Hint;
	}

	while(1)
	{
		int Chr = NextChr;
		CGlyph *pGlyph = pNextGlyph;
		int CharCount = pCur - pText;
		int NumChars = CharCount - Hint.m_CharCount;
		Hint.m_CharCount = CharCount;

		if(Chr == 0 || pCur > pEnd)
		{
			Hint.m_CharCount--;
			break;
		}

		if(!pGlyph || Chr < 0)
		{
			Hint.m_CharCount = -1;
			return Hint;
		}

		NextChr = str_utf8_decode(&pCur);
		pNextGlyph = NULL;
		if(NextChr > 0)
		{
			if(NextChr == '\n' || NextChr == '\t')
				pNextGlyph = m_pGlyphMap->GetGlyph(' ', FontSizeIndex, Render);
			else
				pNextGlyph = m_pGlyphMap->GetGlyph(NextChr, FontSizeIndex, Render);
		}

		vec2 Kerning = m_pGlyphMap->Kerning(pGlyph, pNextGlyph, PixelSize) * Scale;
		float AdvanceX = (pGlyph->m_AdvanceX + Kerning.x) * Size;
	
		bool IsSpace = Chr == '\n' || Chr == '\t' || Chr == ' ';
		bool CanBreak = !IsSpace && (BreakWord || pCursor->m_StartOfLine);
		if(Hint.m_EffectiveAdvanceX - WordStartAdvanceX > MaxWidth || (CanBreak && pCursor->m_Advance.x + AdvanceX > MaxWidth))
		{
			Hint.m_CharCount -= NumChars;
			Hint.m_IsBroken = true;
			break;
		}

		if(Render)
		{
			CScaledGlyph Scaled;
			Scaled.m_pGlyph = pGlyph;
			Scaled.m_Advance = pCursor->m_Advance;
			Scaled.m_Size = Size;
			Scaled.m_Line = pCursor->m_LineCount - 1;
			Scaled.m_TextColor = vec4(m_TextR, m_TextG, m_TextB, m_TextA);
			Scaled.m_SecondaryColor = vec4(m_TextSecondaryR, m_TextSecondaryG, m_TextSecondaryB, m_TextSecondaryA);
			Scaled.m_NumChars = NumChars;
			pCursor->m_Glyphs.add(Scaled);
		}
		
		pCursor->m_Advance.x += AdvanceX;
		Hint.m_GlyphCount++;

		if(IsSpace || Chr == 0)
		{
			Hint.m_EndsWithNewline = Chr == '\n';
			if(AllowNewline && Hint.m_EndsWithNewline)
			{
				// remove redundant space
				Hint.m_GlyphCount--;
				if(Render)
					pCursor->m_Glyphs.remove_index(pCursor->m_Glyphs.size()-1);
			}
			break;
		}

		Hint.m_EffectiveAdvanceX = pCursor->m_Advance.x;

		// break every char on non latin/greek characters
		if(!isWestern(Chr))
			break;
	}

	return Hint;
}